

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_manager.c
# Opt level: O0

int mm_download_tables(mm_context_t *context,char *terminal_id)

{
  uint8_t table_id_00;
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  cashbox_status_univ_t *cashbox_status;
  cashbox_status_univ_t *pcashbox_status;
  int i;
  uint8_t term_model;
  uint8_t table_id;
  uint8_t *table_list;
  uint8_t *table_buffer;
  size_t table_len;
  int status;
  int table_index;
  char *terminal_id_local;
  mm_context_t *context_local;
  
  table_len._0_4_ = 0;
  _status = terminal_id;
  terminal_id_local = (char *)context;
  bVar1 = term_type_to_model(context->terminal_type);
  uVar2 = term_type_to_mtr(terminal_id_local[0x581]);
  if ((uVar2 == 0x424) || (uVar2 == 0x42e)) {
    _i = table_list_mtr17;
  }
  else if (uVar2 == 0x438) {
    _i = table_list_mtr17_intl;
  }
  else if ((((uVar2 == 0x442) || (uVar2 == 0x44c)) || (uVar2 == 0x456)) || (uVar2 == 0x46a)) {
    _i = table_list_mtr19;
  }
  else if (uVar2 == 0x4b0) {
    _i = table_list_mtr_120;
  }
  else if (uVar2 == 2000) {
    _i = table_list_mtr_2x;
  }
  else {
    fprintf(_stderr,"%s: Error: Unknown terminal type %d, defaulting to MTR 1.7\n",
            "mm_download_tables",(ulong)(byte)terminal_id_local[0x581]);
    _i = table_list_mtr17;
  }
  table_len._4_4_ = 0;
  do {
    table_id_00 = _i[table_len._4_4_];
    if (((table_id_00 == '\0') || (manager_running == 0)) ||
       (iVar3 = proto_connected((mm_proto_t *)(terminal_id_local + 0x220)), iVar3 == 0)) {
      iVar3 = proto_connected((mm_proto_t *)(terminal_id_local + 0x220));
      if (iVar3 == 0) {
        printf("%s: Download failed.\n","mm_download_tables");
      }
      else {
        update_terminal_download_time((mm_context_t *)terminal_id_local,_status);
      }
      return (int)table_len;
    }
    if (bVar1 == 3) {
      if ((table_id_00 != '\x16') && (table_id_00 != 0x86)) {
LAB_001110af:
        if (terminal_id_local[0x488] == '\x01') {
          switch(table_id_00) {
          case '\r':
          case '\x15':
          case '\x16':
          case '\x17':
          case '\x18':
          case '\x1a':
          case '\x1f':
          case '2':
          case '>':
          case 'H':
          case 'I':
          case 'J':
          case '\\':
          case ']':
          case 'e':
          case 0x86:
          case 0x87:
          case 0x88:
            break;
          default:
            goto LAB_001113e9;
          }
        }
        switch(table_id_00) {
        case '\r':
          generate_dlog_mt_end_data
                    ((mm_context_t *)terminal_id_local,&table_list,(size_t *)&table_buffer);
          break;
        default:
          printf("\t");
          if ((((terminal_id_local[0x583] == '\0') && ((terminal_id_local[0x582] & 1U) != 0)) &&
              ((terminal_id_local[0x582] & 4U) == 0)) &&
             (((terminal_id_local[0x582] & 8U) == 0 &&
              (iVar3 = check_mm_table_is_newer
                                 ((mm_context_t *)terminal_id_local,_status,table_id_00), iVar3 != 0
              )))) {
            table_list = (uint8_t *)0x0;
            goto LAB_001113e9;
          }
          table_len._0_4_ =
               load_mm_table((mm_context_t *)terminal_id_local,_status,table_id_00,&table_list,
                             (size_t *)&table_buffer);
          if ((int)table_len != 0) {
            if (table_id_00 != '\x1e') {
              if (table_list != (uint8_t *)0x0) {
                free(table_list);
              }
              table_list = (uint8_t *)0x0;
              goto LAB_001113e9;
            }
            generate_user_if_parameters
                      ((mm_context_t *)terminal_id_local,&table_list,(size_t *)&table_buffer);
          }
          break;
        case '\x15':
          uVar2 = term_type_to_mtr(terminal_id_local[0x581]);
          if (uVar2 < 0x46b) {
            generate_term_access_parameters_mtr1
                      ((mm_context_t *)terminal_id_local,_status,&table_list,(size_t *)&table_buffer
                      );
          }
          else {
            generate_term_access_parameters
                      ((mm_context_t *)terminal_id_local,_status,&table_list,(size_t *)&table_buffer
                      );
          }
          break;
        case '\x1f':
          generate_install_parameters
                    ((mm_context_t *)terminal_id_local,&table_list,(size_t *)&table_buffer);
          break;
        case ' ':
          generate_comm_stat_parameters
                    ((mm_context_t *)terminal_id_local,&table_list,(size_t *)&table_buffer);
          break;
        case '\"':
          generate_call_stat_parameters
                    ((mm_context_t *)terminal_id_local,&table_list,(size_t *)&table_buffer);
          break;
        case '#':
          generate_call_in_parameters
                    ((mm_context_t *)terminal_id_local,&table_list,(size_t *)&table_buffer);
          break;
        case '&':
          cashbox_status = (cashbox_status_univ_t *)calloc(1,0x39);
          table_list = (uint8_t *)cashbox_status;
          if (cashbox_status == (cashbox_status_univ_t *)0x0) {
            fprintf(_stderr,"%s: Error: failed to allocate %zu bytes.\n","mm_download_tables",0x39);
            return -0xc;
          }
          mm_acct_load_TCASHST(*(void **)terminal_id_local,_status,cashbox_status);
          cashbox_status->currency_value = cashbox_status->currency_value;
          for (pcashbox_status._0_4_ = 0; (int)pcashbox_status < 8;
              pcashbox_status._0_4_ = (int)pcashbox_status + 1) {
            cashbox_status->coin_count[(int)pcashbox_status] =
                 cashbox_status->coin_count[(int)pcashbox_status];
          }
          table_buffer = (uint8_t *)0x39;
        }
        if (table_id_00 == '\x1a') {
          table_list[1] = bVar1 & 0xf;
        }
        table_len._0_4_ =
             send_mm_table((mm_proto_t *)(terminal_id_local + 0x220),table_list,(size_t)table_buffer
                          );
        if (((int)table_len == 0) && (_i[table_len._4_4_] != '\r')) {
          table_len._0_4_ =
               wait_for_table_ack((mm_proto_t *)(terminal_id_local + 0x220),*table_list);
        }
        free(table_list);
        table_list = (uint8_t *)0x0;
      }
    }
    else if (((bVar1 != 1) && (bVar1 != 0x11)) || (table_id_00 != '2')) goto LAB_001110af;
LAB_001113e9:
    table_len._4_4_ = table_len._4_4_ + 1;
  } while( true );
}

Assistant:

static int mm_download_tables(mm_context_t *context, char *terminal_id) {
    int      table_index;
    int      status = 0;
    size_t   table_len;
    uint8_t *table_buffer;
    uint8_t *table_list = table_list_mtr_2x;
    uint8_t  table_id;
    uint8_t  term_model = term_type_to_model(context->terminal_type);

    switch (term_type_to_mtr(context->terminal_type)) {
    case MTR_2_X:
        table_list = table_list_mtr_2x;
        break;
    case MTR_1_20:
        table_list = table_list_mtr_120;
        break;
    case MTR_1_13:
    case MTR_1_11:
    case MTR_1_10:
    case MTR_1_9:
        table_list = table_list_mtr19;
        break;
    case MTR_1_7_INTL:
        table_list = table_list_mtr17_intl;
        break;
    case MTR_1_7:
    case MTR_1_6:
        table_list = table_list_mtr17;
        break;
    default:
        fprintf(stderr, "%s: Error: Unknown terminal type %d, defaulting to MTR 1.7\n", __func__, context->terminal_type);
        table_list = table_list_mtr17;
        break;
    }

    for (table_index = 0; (table_id = table_list[table_index]) > 0; table_index++) {
        /* Abort table download if manager is shutting down. */
        if (!manager_running) break;
        if (!proto_connected(&context->connection.proto)) break;

        /* Skip DLOG_MT_CARD_TABLE, DLOG_MT_CARD_TABLE_EXP if the terminal is coin-only. */
        if (term_model == TERM_COIN_BASIC) {
            switch (table_id) {
            case DLOG_MT_CARD_TABLE:
            case DLOG_MT_CARD_TABLE_EXP:
                continue;
            default:
                break;
            }
        }
        else if (((term_model == TERM_CARD) || (term_model == TERM_DESK)) && (table_id == DLOG_MT_COIN_VAL_TABLE)) {
            /* Skip DLOG_MT_COIN_VAL_TABLE for card-only terminals */
            continue;
        }

        /* If -s was specified, only download mandatory tables */
        if (context->minimal_table_set == 1) {
            switch (table_id) {
            case DLOG_MT_NCC_TERM_PARAMS:
            case DLOG_MT_CARD_TABLE:
            case DLOG_MT_CARRIER_TABLE:
            case DLOG_MT_CALLSCRN_UNIVERSAL:
            case DLOG_MT_FCONFIG_OPTS:
            case DLOG_MT_INSTALL_PARAMS:
            case DLOG_MT_COIN_VAL_TABLE:
            case DLOG_MT_NUM_PLAN_TABLE:
            case DLOG_MT_SPARE_TABLE:
            case DLOG_MT_RATE_TABLE:
            case DLOG_MT_CALL_SCREEN_LIST:
            case DLOG_MT_SCARD_PARM_TABLE:
            case DLOG_MT_CARD_TABLE_EXP:
            case DLOG_MT_CARRIER_TABLE_EXP:
            case DLOG_MT_NPA_NXX_TABLE_1:
            case DLOG_MT_COMP_LCD_TABLE_1:
            case DLOG_MT_LCD_TABLE_1:
            case DLOG_MT_END_DATA:
                break;
            default: /* Skip tables that are not mandatory */
                continue;
            }
        }

        switch (table_id) {
            case DLOG_MT_INSTALL_PARAMS:
                generate_install_parameters(context, &table_buffer, &table_len);
                break;
            case DLOG_MT_CALL_IN_PARMS:
                generate_call_in_parameters(context, &table_buffer, &table_len);
                break;
            case DLOG_MT_NCC_TERM_PARAMS:
                if (term_type_to_mtr(context->terminal_type) <= MTR_1_13) {
                    generate_term_access_parameters_mtr1(context, terminal_id, &table_buffer, &table_len);
                } else {
                    generate_term_access_parameters(context, terminal_id, &table_buffer, &table_len);
                }
                break;
            case DLOG_MT_CALL_STAT_PARMS:
                generate_call_stat_parameters(context, &table_buffer, &table_len);
                break;
            case DLOG_MT_COMM_STAT_PARMS:
                generate_comm_stat_parameters(context, &table_buffer, &table_len);
                break;
            case DLOG_MT_END_DATA:
                generate_dlog_mt_end_data(context, &table_buffer, &table_len);
                break;
            case DLOG_MT_CASH_BOX_STATUS:
            {
                int i;
                cashbox_status_univ_t *pcashbox_status = { 0 };
                pcashbox_status = (cashbox_status_univ_t *)calloc(1, sizeof(cashbox_status_univ_t));
                table_buffer = (uint8_t*)pcashbox_status;
                if (table_buffer == NULL) {
                    fprintf(stderr, "%s: Error: failed to allocate %zu bytes.\n", __func__, sizeof(cashbox_status_univ_t));
                    return -ENOMEM;
                }
                mm_acct_load_TCASHST(context->database, terminal_id, (cashbox_status_univ_t *)table_buffer);

                /* Perform endian conversion */
                pcashbox_status->currency_value = LE16(pcashbox_status->currency_value);
                for (i = 0; i < COIN_COUNT_MAX; i++) {
                    pcashbox_status->coin_count[i] = LE16(pcashbox_status->coin_count[i]);
                }

                table_len = sizeof(cashbox_status_univ_t);
                break;
            }
            default:
                printf("\t");
                /* For Craft Force Download, only download tables that are newer,
                 * unless the terminal lost its memory or the the "-c" option was
                 * selected.
                 */
                if ((context->complete_download == FALSE) &&
                    (context->terminal_upd_reason & TTBLREQ_CRAFT_FORCE_DL) &&
                    !(context->terminal_upd_reason & TTBLREQ_LOST_MEMORY) &&
                    !(context->terminal_upd_reason & TTBLREQ_PWR_LOST_ON_DL)) {
                    if (check_mm_table_is_newer(context, terminal_id, table_id) != 0) {
                        table_buffer = NULL;
                        continue;
                    }
                }

                status = load_mm_table(context, terminal_id, table_id, &table_buffer, &table_len);

                if (status != 0) {
                    if (table_id == DLOG_MT_USER_IF_PARMS) { /* Can't load DLOG_MT_USER_IF_PARMS, generate it. */
                        generate_user_if_parameters(context, &table_buffer, &table_len);
                    }
                    else { /* If table can't be loaded, continue to the next. */
                        if (table_buffer != NULL) free(table_buffer);
                        table_buffer = NULL;
                        continue;
                    }
                }
                break;
        }

        /* Update DLOG_MT_FCONFIG_OPTS based on terminal type. */
        if (table_id == DLOG_MT_FCONFIG_OPTS) {
            ((dlog_mt_fconfig_opts_t*)table_buffer)->term_type = term_model & 0x0F;
        }

        status = send_mm_table(&context->connection.proto, table_buffer, table_len);

        if (status == PKT_SUCCESS) {
            /* For all tables except END_OF_DATA, expect a table ACK. */
            if (table_list[table_index] != DLOG_MT_END_DATA) {
                status = wait_for_table_ack(&context->connection.proto, table_buffer[0]);
            }
        }

        free(table_buffer);
        table_buffer = NULL;

    }

    if (proto_connected(&context->connection.proto)) {
        /* Update table download time. */
        update_terminal_download_time(context, terminal_id);
    } else {
        printf("%s: Download failed.\n", __func__);
    }

    return status;
}